

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

void message_flush(game_event_type unused,game_event_data *data,void *user)

{
  int *h_00;
  wchar_t w;
  wchar_t h;
  undefined8 local_8;
  
  if (msg_flag) {
    if (message_column == L'\0') {
      return;
    }
    if (Term != (term *)0x0) {
      local_8 = &Term;
      h_00 = (int *)((long)&local_8 + 4);
      Term_get_size((int *)&local_8,h_00);
      while ((wchar_t)local_8 + L'\xfffffff8' < message_column) {
        msg_flush_split_existing((wchar_t)local_8,h_00);
      }
      if (message_column != L'\0') {
        msg_flush(message_column);
      }
    }
    msg_flag = false;
  }
  message_column = L'\0';
  return;
}

Assistant:

void message_flush(game_event_type unused, game_event_data *data, void *user)
{
	/* Hack -- Reset */
	if (!msg_flag) message_column = 0;

	/* Flush when needed */
	if (message_column) {
		/* Print pending messages */
		if (Term) {
			int w, h;

			(void)Term_get_size(&w, &h);
			while (message_column > w - 8) {
				msg_flush_split_existing(w, &message_column);
			}
			if (message_column) {
				msg_flush(message_column);
			}
		}

		/* Forget it */
		msg_flag = false;

		/* Reset */
		message_column = 0;
	}
}